

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_window.cpp
# Opt level: O1

ProgressData * __thiscall
duckdb::PhysicalWindow::GetProgress
          (ProgressData *__return_storage_ptr__,PhysicalWindow *this,ClientContext *context,
          GlobalSourceState *gsource_p)

{
  undefined8 uVar1;
  __int_type _Var2;
  pointer pWVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  uVar1 = *(undefined8 *)
           ((long)&gsource_p[2].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex +
           0x18);
  pWVar3 = unique_ptr<duckdb::WindowPartitionGlobalSinkState,_std::default_delete<duckdb::WindowPartitionGlobalSinkState>,_true>
           ::operator->((unique_ptr<duckdb::WindowPartitionGlobalSinkState,_std::default_delete<duckdb::WindowPartitionGlobalSinkState>,_true>
                         *)(*(long *)&gsource_p[1].super_StateWithBlockableTasks + 0x68));
  _Var2 = (pWVar3->super_PartitionGlobalSinkState).count.super___atomic_base<unsigned_long>._M_i;
  __return_storage_ptr__->done = 0.0;
  __return_storage_ptr__->total = 0.0;
  __return_storage_ptr__->invalid = false;
  if (_Var2 == 0) {
    __return_storage_ptr__->invalid = true;
    __return_storage_ptr__->done = 0.0;
    dVar4 = 1.0;
  }
  else {
    auVar5._8_4_ = (int)((ulong)uVar1 >> 0x20);
    auVar5._0_8_ = uVar1;
    auVar5._12_4_ = 0x45300000;
    __return_storage_ptr__->done =
         (auVar5._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
    auVar6._8_4_ = (int)(_Var2 >> 0x20);
    auVar6._0_8_ = _Var2;
    auVar6._12_4_ = 0x45300000;
    dVar4 = (auVar6._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)_Var2) - 4503599627370496.0);
  }
  __return_storage_ptr__->total = dVar4;
  return __return_storage_ptr__;
}

Assistant:

ProgressData PhysicalWindow::GetProgress(ClientContext &context, GlobalSourceState &gsource_p) const {
	auto &gsource = gsource_p.Cast<WindowGlobalSourceState>();
	const auto returned = gsource.returned.load();

	auto &gsink = gsource.gsink;
	const auto count = gsink.global_partition->count.load();
	ProgressData res;
	if (count) {
		res.done = double(returned);
		res.total = double(count);
	} else {
		res.SetInvalid();
	}
	return res;
}